

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkDetectClassesTest2(Abc_Ntk_t *pNtk,int fVerbose,int fVeryVerbose)

{
  Vec_Wec_t *in_RAX;
  Vec_Int_t *vObjs;
  void *pvVar1;
  Vec_Wec_t *p;
  int i;
  Vec_Wec_t *vCos;
  Vec_Wec_t *local_28;
  
  local_28 = in_RAX;
  vObjs = Vec_IntAlloc(pNtk->vCis->nSize);
  for (i = 0; i < pNtk->vCis->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pNtk->vCis,i);
    Vec_IntPush(vObjs,*(int *)((long)pvVar1 + 0x10));
  }
  p = Abc_NtkDetectObjClasses(pNtk,vObjs,&local_28);
  Vec_WecPrint(p,0);
  Vec_WecPrint(local_28,0);
  Vec_IntFree(vObjs);
  Vec_WecFree(p);
  Vec_WecFree(local_28);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest2( Abc_Ntk_t * pNtk, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vObjs;
    Vec_Wec_t * vRes, * vCos;
    // for testing, create the set of object IDs for all combinational inputs (CIs)
    Abc_Obj_t * pObj; int i;
    vObjs = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vObjs, Abc_ObjId(pObj) );
    // compute equivalence classes of CIs and print them
    vRes = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCos );
    Vec_WecPrint( vRes, 0 );
    Vec_WecPrint( vCos, 0 );
    // clean up
    Vec_IntFree( vObjs );
    Vec_WecFree( vRes );
    Vec_WecFree( vCos );
}